

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O0

void QWindowContainer::parentWasChanged(QWidget *parent)

{
  QWindowContainerPrivate *parent_00;
  QWindow *pQVar1;
  long lVar2;
  QObject *pQVar3;
  QWidget *this;
  QWidgetPrivate *in_RDI;
  QWindowContainerPrivate *unaff_retaddr;
  QWidgetPrivate *tld;
  QWidget *toplevel;
  QWindowContainerPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  QWindowContainerPrivate *in_stack_ffffffffffffffe0;
  QWidgetPrivate *in_stack_ffffffffffffffe8;
  
  parent_00 = QWindowContainerPrivate::get(in_stack_ffffffffffffffc8);
  if (parent_00 != (QWindowContainerPrivate *)0x0) {
    pQVar1 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3bb099);
    lVar2 = QWindow::parent(pQVar1,0);
    if (lVar2 != 0) {
      QWindowContainerPrivate::updateUsesNativeWidgets(in_stack_ffffffffffffffe0);
      QWindowContainerPrivate::markParentChain(in_stack_ffffffffffffffe0);
      if ((parent_00->field_0x290 & 1) == 0) {
        in_RDI = (QWidgetPrivate *)QWidget::window((QWidget *)in_stack_ffffffffffffffe0);
      }
      in_stack_ffffffffffffffe8 = in_RDI;
      pQVar1 = QWidget::windowHandle(in_stack_ffffffffffffffd0);
      if (pQVar1 == (QWindow *)0x0) {
        QWidgetPrivate::get((QWidget *)0x3bb115);
        QWidgetPrivate::createTLExtra(in_RDI);
        QWidgetPrivate::createTLSysExtra(tld);
      }
      pQVar1 = QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3bb13f);
      pQVar3 = (QObject *)QWindow::parent(pQVar1,0);
      QObject::removeEventFilter(pQVar3);
      this = (QWidget *)QPointer<QWindow>::operator->((QPointer<QWindow> *)0x3bb167);
      QWidget::windowHandle(this);
      QWindow::setParent((QWindow *)this);
      pQVar1 = QWidget::windowHandle(this);
      QObject::installEventFilter((QObject *)pQVar1);
      QWindow::destroy();
      QWindowContainerPrivate::updateGeometry(unaff_retaddr);
    }
  }
  qwindowcontainer_traverse
            ((QWidget *)parent_00,(qwindowcontainer_traverse_callback)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void QWindowContainer::parentWasChanged(QWidget *parent)
{
    if (QWindowContainerPrivate *d = QWindowContainerPrivate::get(parent)) {
        if (d->window->parent()) {
            d->updateUsesNativeWidgets();
            d->markParentChain();
            QWidget *toplevel = d->usesNativeWidgets ? parent : parent->window();
            if (!toplevel->windowHandle()) {
                QWidgetPrivate *tld = static_cast<QWidgetPrivate *>(QWidgetPrivate::get(toplevel));
                tld->createTLExtra();
                tld->createTLSysExtra();
                Q_ASSERT(toplevel->windowHandle());
            }
            d->window->parent()->removeEventFilter(parent);
            d->window->setParent(toplevel->windowHandle());
            toplevel->windowHandle()->installEventFilter(parent);
            d->fakeParent.destroy();
            d->updateGeometry();
        }
    }
    qwindowcontainer_traverse(parent, parentWasChanged);
}